

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal_input_parser.cpp
# Opt level: O0

Output * __thiscall
ftxui::TerminalInputParser::ParseMouse
          (Output *__return_storage_ptr__,TerminalInputParser *this,bool altered,bool pressed,
          vector<int,_std::allocator<int>_> *arguments)

{
  uint uVar1;
  size_type sVar2;
  uint *puVar3;
  reference pvVar4;
  vector<int,_std::allocator<int>_> *arguments_local;
  bool pressed_local;
  bool altered_local;
  TerminalInputParser *this_local;
  
  sVar2 = std::vector<int,_std::allocator<int>_>::size(arguments);
  if (sVar2 == 3) {
    Output::Output(__return_storage_ptr__,MOUSE);
    puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](arguments,0);
    uVar1 = *puVar3;
    puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](arguments,0);
    (__return_storage_ptr__->field_1).mouse.button = (uVar1 & 3) + ((int)(*puVar3 & 0x40) >> 4);
    *(uint *)((long)&__return_storage_ptr__->field_1 + 4) = (uint)pressed;
    puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](arguments,0);
    (__return_storage_ptr__->field_1).mouse.shift = (*puVar3 & 4) != 0;
    puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](arguments,0);
    (__return_storage_ptr__->field_1).mouse.meta = (*puVar3 & 8) != 0;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](arguments,1);
    (__return_storage_ptr__->field_1).mouse.x = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](arguments,2);
    (__return_storage_ptr__->field_1).mouse.y = *pvVar4;
  }
  else {
    Output::Output(__return_storage_ptr__,SPECIAL);
  }
  return __return_storage_ptr__;
}

Assistant:

TerminalInputParser::Output TerminalInputParser::ParseMouse(
    bool altered,
    bool pressed,
    std::vector<int> arguments) {
  if (arguments.size() != 3)
    return SPECIAL;

  (void)altered;

  Output output(MOUSE);
  output.mouse.button = Mouse::Button((arguments[0] & 3) +  //
                                      ((arguments[0] & 64) >> 4));
  output.mouse.motion = Mouse::Motion(pressed);
  output.mouse.shift = bool(arguments[0] & 4);
  output.mouse.meta = bool(arguments[0] & 8);
  output.mouse.x = arguments[1];
  output.mouse.y = arguments[2];
  return output;
}